

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iGenfuner.cpp
# Opt level: O0

bool __thiscall Imaginer::Utils::iGenFuner::generater(iGenFuner *this)

{
  bool bVar1;
  int iVar2;
  iStack<Imaginer::Utils::iRpn::RPNnode> *this_00;
  RPNnode *pRVar3;
  ostream *poVar4;
  double dVar5;
  RPNnode local_200;
  Fun local_1f0;
  _funer local_1e8;
  Fun local_1d8;
  _funer local_1d0;
  RPNnode local_1c0;
  Fun local_1b0;
  _funer local_1a8;
  Fun local_198;
  _funer local_190;
  RPNnode local_180;
  Fun local_170;
  _funer local_168;
  Fun local_158;
  _funer local_150;
  RPNnode local_140;
  Fun local_130;
  _funer local_128;
  Fun local_118;
  _funer local_110;
  RPNnode local_100;
  Fun local_f0;
  _funer local_e8;
  Fun local_d8;
  _funer local_d0;
  RPNnode local_c0;
  int local_b0;
  byte local_a9;
  int i;
  bool top_bottom;
  RPNnode roperand;
  RPNnode loperand;
  undefined1 local_80 [6];
  bool haveXY;
  char op;
  RPNnode curnode;
  int size;
  iStack<Imaginer::Utils::iRpn::RPNnode> *_operands;
  undefined1 local_58 [8];
  iStack<Imaginer::Utils::iRpn::RPNnode> result;
  undefined1 local_38 [8];
  iRpn rpn;
  iGenFuner *this_local;
  
  rpn._operands = (iStack<Imaginer::Utils::iRpn::RPNnode> *)this;
  iRpn::iRpn((iRpn *)local_38,this->_expname);
  bVar1 = iRpn::genRpn((iRpn *)local_38);
  if (bVar1) {
    _operands._4_4_ = 0x400;
    iStack<Imaginer::Utils::iRpn::RPNnode>::iStack
              ((iStack<Imaginer::Utils::iRpn::RPNnode> *)local_58,(int *)((long)&_operands + 4));
    this_00 = iRpn::getOperands((iRpn *)local_38);
    curnode._12_4_ = iStack<Imaginer::Utils::iRpn::RPNnode>::size(this_00);
    iRpn::RPNnode::RPNnode((RPNnode *)local_80);
    loperand._15_1_ = 0;
    loperand._14_1_ = 0;
    iRpn::RPNnode::RPNnode((RPNnode *)&roperand._is);
    iRpn::RPNnode::RPNnode((RPNnode *)&i);
    local_a9 = 0;
    for (local_b0 = 0; local_b0 <= (int)curnode._12_4_; local_b0 = local_b0 + 1) {
      pRVar3 = iStack<Imaginer::Utils::iRpn::RPNnode>::operator[](this_00,local_b0);
      iRpn::RPNnode::operator=((RPNnode *)local_80,pRVar3);
      bVar1 = iRpn::RPNnode::operator_cast_to_bool((RPNnode *)local_80);
      if (bVar1) {
        iStack<Imaginer::Utils::iRpn::RPNnode>::push
                  ((iStack<Imaginer::Utils::iRpn::RPNnode> *)local_58,(RPNnode *)local_80);
        poVar4 = operator<<((ostream *)&std::cout,(RPNnode *)local_80);
        std::operator<<(poVar4,anon_var_dwarf_12381 + 0x16);
      }
      else {
        loperand._15_1_ = iRpn::RPNnode::operator_cast_to_char((RPNnode *)local_80);
        bVar1 = iRpn::isVariable((iRpn *)local_38,&loperand.field_0xf);
        if (bVar1) {
          loperand._14_1_ = 1;
          iRpn::RPNnode::RPNnode(&local_c0,loperand._15_1_);
          iStack<Imaginer::Utils::iRpn::RPNnode>::push
                    ((iStack<Imaginer::Utils::iRpn::RPNnode> *)local_58,&local_c0);
          bVar1 = iStack<Imaginer::Utils::iRpn::RPNnode>::empty
                            ((iStack<Imaginer::Utils::iRpn::RPNnode> *)local_58);
          if (!bVar1) {
            local_a9 = 1;
          }
        }
        else {
          iVar2 = iStack<Imaginer::Utils::iRpn::RPNnode>::size
                            ((iStack<Imaginer::Utils::iRpn::RPNnode> *)local_58);
          if (iVar2 < 1) {
            poVar4 = std::operator<<((ostream *)&std::cout,"expression invaild: ");
            poVar4 = std::operator<<(poVar4,loperand._15_1_);
            poVar4 = std::operator<<(poVar4," need two operands");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            this_local._7_1_ = false;
            goto LAB_00107412;
          }
          pRVar3 = iStack<Imaginer::Utils::iRpn::RPNnode>::pop
                             ((iStack<Imaginer::Utils::iRpn::RPNnode> *)local_58);
          iRpn::RPNnode::operator=((RPNnode *)&roperand._is,pRVar3);
          pRVar3 = iStack<Imaginer::Utils::iRpn::RPNnode>::pop
                             ((iStack<Imaginer::Utils::iRpn::RPNnode> *)local_58);
          iRpn::RPNnode::operator=((RPNnode *)&i,pRVar3);
          if (loperand._15_1_ == '*') {
            if ((loperand._14_1_ & 1) == 0) {
              dVar5 = iRpn::RPNnode::operator*((RPNnode *)&roperand._is,(RPNnode *)&i);
              iRpn::RPNnode::RPNnode(&local_180,dVar5);
              iStack<Imaginer::Utils::iRpn::RPNnode>::push
                        ((iStack<Imaginer::Utils::iRpn::RPNnode> *)local_58,&local_180);
            }
            else if ((local_a9 & 1) == 0) {
              local_170 = _funer::_add;
              dVar5 = iRpn::RPNnode::operator_cast_to_double((RPNnode *)&roperand._is);
              _funer::_funer(&local_168,&local_170,dVar5);
              iStack<Imaginer::Utils::iGenFuner::_funer>::push(&this->_opstream,&local_168);
            }
            else {
              local_158 = _funer::_add;
              dVar5 = iRpn::RPNnode::operator_cast_to_double((RPNnode *)&roperand._is);
              _funer::_funer(&local_150,&local_158,dVar5);
              iStack<Imaginer::Utils::iGenFuner::_funer>::push(&this->_opstream,&local_150);
            }
          }
          else if (loperand._15_1_ == '+') {
            if ((loperand._14_1_ & 1) == 0) {
              dVar5 = iRpn::RPNnode::operator+((RPNnode *)&roperand._is,(RPNnode *)&i);
              iRpn::RPNnode::RPNnode(&local_100,dVar5);
              iStack<Imaginer::Utils::iRpn::RPNnode>::push
                        ((iStack<Imaginer::Utils::iRpn::RPNnode> *)local_58,&local_100);
            }
            else if ((local_a9 & 1) == 0) {
              local_f0 = _funer::_add;
              dVar5 = iRpn::RPNnode::operator_cast_to_double((RPNnode *)&roperand._is);
              _funer::_funer(&local_e8,&local_f0,dVar5);
              iStack<Imaginer::Utils::iGenFuner::_funer>::push(&this->_opstream,&local_e8);
            }
            else {
              local_d8 = _funer::_add;
              dVar5 = iRpn::RPNnode::operator_cast_to_double((RPNnode *)&roperand._is);
              _funer::_funer(&local_d0,&local_d8,dVar5);
              iStack<Imaginer::Utils::iGenFuner::_funer>::push(&this->_opstream,&local_d0);
            }
          }
          else if (loperand._15_1_ == '-') {
            if ((loperand._14_1_ & 1) == 0) {
              dVar5 = iRpn::RPNnode::operator-((RPNnode *)&roperand._is,(RPNnode *)&i);
              iRpn::RPNnode::RPNnode(&local_140,dVar5);
              iStack<Imaginer::Utils::iRpn::RPNnode>::push
                        ((iStack<Imaginer::Utils::iRpn::RPNnode> *)local_58,&local_140);
            }
            else if ((local_a9 & 1) == 0) {
              local_130 = _funer::_add;
              dVar5 = iRpn::RPNnode::operator_cast_to_double((RPNnode *)&roperand._is);
              _funer::_funer(&local_128,&local_130,dVar5);
              iStack<Imaginer::Utils::iGenFuner::_funer>::push(&this->_opstream,&local_128);
            }
            else {
              local_118 = _funer::_add;
              dVar5 = iRpn::RPNnode::operator_cast_to_double((RPNnode *)&roperand._is);
              _funer::_funer(&local_110,&local_118,dVar5);
              iStack<Imaginer::Utils::iGenFuner::_funer>::push(&this->_opstream,&local_110);
            }
          }
          else if (loperand._15_1_ == '/') {
            if ((loperand._14_1_ & 1) == 0) {
              dVar5 = iRpn::RPNnode::operator/((RPNnode *)&roperand._is,(RPNnode *)&i);
              iRpn::RPNnode::RPNnode(&local_1c0,dVar5);
              iStack<Imaginer::Utils::iRpn::RPNnode>::push
                        ((iStack<Imaginer::Utils::iRpn::RPNnode> *)local_58,&local_1c0);
            }
            else if ((local_a9 & 1) == 0) {
              local_1b0 = _funer::_add;
              dVar5 = iRpn::RPNnode::operator_cast_to_double((RPNnode *)&roperand._is);
              _funer::_funer(&local_1a8,&local_1b0,dVar5);
              iStack<Imaginer::Utils::iGenFuner::_funer>::push(&this->_opstream,&local_1a8);
            }
            else {
              local_198 = _funer::_add;
              dVar5 = iRpn::RPNnode::operator_cast_to_double((RPNnode *)&roperand._is);
              _funer::_funer(&local_190,&local_198,dVar5);
              iStack<Imaginer::Utils::iGenFuner::_funer>::push(&this->_opstream,&local_190);
            }
          }
          else if (loperand._15_1_ == '^') {
            if ((loperand._14_1_ & 1) == 0) {
              dVar5 = iRpn::RPNnode::operator^((RPNnode *)&roperand._is,(RPNnode *)&i);
              iRpn::RPNnode::RPNnode(&local_200,dVar5);
              iStack<Imaginer::Utils::iRpn::RPNnode>::push
                        ((iStack<Imaginer::Utils::iRpn::RPNnode> *)local_58,&local_200);
            }
            else if ((local_a9 & 1) == 0) {
              local_1f0 = _funer::_add;
              dVar5 = iRpn::RPNnode::operator_cast_to_double((RPNnode *)&roperand._is);
              _funer::_funer(&local_1e8,&local_1f0,dVar5);
              iStack<Imaginer::Utils::iGenFuner::_funer>::push(&this->_opstream,&local_1e8);
            }
            else {
              local_1d8 = _funer::_add;
              dVar5 = iRpn::RPNnode::operator_cast_to_double((RPNnode *)&roperand._is);
              _funer::_funer(&local_1d0,&local_1d8,dVar5);
              iStack<Imaginer::Utils::iGenFuner::_funer>::push(&this->_opstream,&local_1d0);
            }
          }
        }
      }
    }
    poVar4 = operator<<((ostream *)&std::cout,(iStack<Imaginer::Utils::iRpn::RPNnode> *)local_58);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = true;
LAB_00107412:
    result._size = 1;
    iStack<Imaginer::Utils::iRpn::RPNnode>::~iStack
              ((iStack<Imaginer::Utils::iRpn::RPNnode> *)local_58);
  }
  else {
    this_local._7_1_ = false;
    result._size = 1;
  }
  iRpn::~iRpn((iRpn *)local_38);
  return this_local._7_1_;
}

Assistant:

bool   iGenFuner::generater()
{
    iRpn rpn(_expname);
    if(! rpn.genRpn())
        return false;
    iStack<iRpn::RPNnode> result;
    iStack<iRpn::RPNnode>* _operands = rpn.getOperands();
    int size = _operands->size();
    iRpn::RPNnode curnode;    
    char op = '\0';
    bool haveXY = false;
    iRpn::RPNnode  loperand;
    iRpn::RPNnode  roperand;
    bool top_bottom = false;//flag to record a unkowns value is top(true) or bottom(false)
    for(int i = 0;i <= size; ++i)
    {
        curnode = (*_operands)[i];
        if(!curnode)//opearator
        {
            op = curnode;
            if(rpn.isVariable(op))//未知数
            {
                haveXY = true;
                result.push(op);
                if(!result.empty())
                {
                    top_bottom = true;
                }
            }else
            {
                if(result.size() < 1)
                {
                    std::cout << "expression invaild: " << op  <<
                                 " need two operands" << std::endl;
                    return false;
                }
                loperand = result.pop();
                roperand = result.pop();
                switch (op) {
                case '+':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));
                        break;
                    }
                    result.push(loperand+roperand);
                    break;
                case '-':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));
                        break;
                    }
                    result.push(loperand-roperand);
                    break;
                case '*':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));

                        break;
                    }
                    result.push(loperand*roperand);
                    break;
                case '/':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));
                        break;
                    }
                    result.push(loperand/roperand);
                    break;
                case '^':
                    if(haveXY)
                    {
                        if(top_bottom)
                            _opstream.push(_funer(_funer::_add,loperand));
                        else
                            _opstream.push(_funer(_funer::_add,loperand));
                        break;
                    }
                    result.push(loperand^roperand);
                    break;
                default:
                    break;
                }
            }
        }
        else//operand
        {
            result.push(curnode);
            std::cout << curnode << "\n";
        }
    }
    std::cout << result << std::endl;
    //result.destroy();
    return true;
}